

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O2

int UnityGetAudioEffectDefinitions(UnityAudioEffectDefinition ***definitionptr)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  UnityAudioEffectDefinition *pUVar4;
  
  if (UnityGetAudioEffectDefinitions::numeffects == 0) {
    UnityGetAudioEffectDefinitions::numeffects = 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition,"Demo Equalizer",
                  Equalizer::CreateCallback,Equalizer::ReleaseCallback,Equalizer::ProcessCallback,
                  Equalizer::SetFloatParameterCallback,Equalizer::GetFloatParameterCallback,
                  Equalizer::GetFloatBufferCallback,Equalizer::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo ImpactGenerator",
                  ImpactGenerator::CreateCallback,ImpactGenerator::ReleaseCallback,
                  ImpactGenerator::ProcessCallback,ImpactGenerator::SetFloatParameterCallback,
                  ImpactGenerator::GetFloatParameterCallback,ImpactGenerator::GetFloatBufferCallback
                  ,ImpactGenerator::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo ImpulseGenerator",
                  ImpulseGenerator::CreateCallback,ImpulseGenerator::ReleaseCallback,
                  ImpulseGenerator::ProcessCallback,ImpulseGenerator::SetFloatParameterCallback,
                  ImpulseGenerator::GetFloatParameterCallback,
                  ImpulseGenerator::GetFloatBufferCallback,
                  ImpulseGenerator::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo LevelMixer",
                  LevelMixer::CreateCallback,LevelMixer::ReleaseCallback,LevelMixer::ProcessCallback
                  ,LevelMixer::SetFloatParameterCallback,LevelMixer::GetFloatParameterCallback,
                  LevelMixer::GetFloatBufferCallback,LevelMixer::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo Lofinator",
                  Lofinator::CreateCallback,Lofinator::ReleaseCallback,Lofinator::ProcessCallback,
                  Lofinator::SetFloatParameterCallback,Lofinator::GetFloatParameterCallback,
                  Lofinator::GetFloatBufferCallback,Lofinator::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo ModalFilter",
                  ModalFilter::CreateCallback,ModalFilter::ReleaseCallback,
                  ModalFilter::ProcessCallback,ModalFilter::SetFloatParameterCallback,
                  ModalFilter::GetFloatParameterCallback,ModalFilter::GetFloatBufferCallback,
                  ModalFilter::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo Multiband",
                  Multiband::CreateCallback,Multiband::ReleaseCallback,Multiband::ProcessCallback,
                  Multiband::SetFloatParameterCallback,Multiband::GetFloatParameterCallback,
                  Multiband::GetFloatBufferCallback,Multiband::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo NoiseBox",
                  NoiseBox::CreateCallback,NoiseBox::ReleaseCallback,NoiseBox::ProcessCallback,
                  NoiseBox::SetFloatParameterCallback,NoiseBox::GetFloatParameterCallback,
                  NoiseBox::GetFloatBufferCallback,NoiseBox::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo PitchDetector",
                  PitchDetector::CreateCallback,PitchDetector::ReleaseCallback,
                  PitchDetector::ProcessCallback,PitchDetector::SetFloatParameterCallback,
                  PitchDetector::GetFloatParameterCallback,PitchDetector::GetFloatBufferCallback,
                  PitchDetector::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo RingModulator",
                  RingModulator::CreateCallback,RingModulator::ReleaseCallback,
                  RingModulator::ProcessCallback,RingModulator::SetFloatParameterCallback,
                  RingModulator::GetFloatParameterCallback,RingModulator::GetFloatBufferCallback,
                  RingModulator::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo StereoWidener",
                  StereoWidener::CreateCallback,StereoWidener::ReleaseCallback,
                  StereoWidener::ProcessCallback,StereoWidener::SetFloatParameterCallback,
                  StereoWidener::GetFloatParameterCallback,StereoWidener::GetFloatBufferCallback,
                  StereoWidener::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo TeeBee3o3",
                  TeeBee::CreateCallback,TeeBee::ReleaseCallback,TeeBee::ProcessCallback,
                  TeeBee::SetFloatParameterCallback,TeeBee::GetFloatParameterCallback,
                  TeeBee::GetFloatBufferCallback,TeeBee::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo TeeDee9o9",
                  TeeDee::CreateCallback,TeeDee::ReleaseCallback,TeeDee::ProcessCallback,
                  TeeDee::SetFloatParameterCallback,TeeDee::GetFloatParameterCallback,
                  TeeDee::GetFloatBufferCallback,TeeDee::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo TubeResonator",
                  TubeResonator::CreateCallback,TubeResonator::ReleaseCallback,
                  TubeResonator::ProcessCallback,TubeResonator::SetFloatParameterCallback,
                  TubeResonator::GetFloatParameterCallback,TubeResonator::GetFloatBufferCallback,
                  TubeResonator::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo Vocoder",
                  Vocoder::CreateCallback,Vocoder::ReleaseCallback,Vocoder::ProcessCallback,
                  Vocoder::SetFloatParameterCallback,Vocoder::GetFloatParameterCallback,
                  Vocoder::GetFloatBufferCallback,Vocoder::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo WahWah",
                  WahWah::CreateCallback,WahWah::ReleaseCallback,WahWah::ProcessCallback,
                  WahWah::SetFloatParameterCallback,WahWah::GetFloatParameterCallback,
                  WahWah::GetFloatBufferCallback,WahWah::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo ConvolutionReverb",
                  ConvolutionReverb::CreateCallback,ConvolutionReverb::ReleaseCallback,
                  ConvolutionReverb::ProcessCallback,ConvolutionReverb::SetFloatParameterCallback,
                  ConvolutionReverb::GetFloatParameterCallback,
                  ConvolutionReverb::GetFloatBufferCallback,
                  ConvolutionReverb::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo CorrelationMeter",
                  CorrelationMeter::CreateCallback,CorrelationMeter::ReleaseCallback,
                  CorrelationMeter::ProcessCallback,CorrelationMeter::SetFloatParameterCallback,
                  CorrelationMeter::GetFloatParameterCallback,
                  CorrelationMeter::GetFloatBufferCallback,
                  CorrelationMeter::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo Granulator",
                  Granulator::CreateCallback,Granulator::ReleaseCallback,Granulator::ProcessCallback
                  ,Granulator::SetFloatParameterCallback,Granulator::GetFloatParameterCallback,
                  Granulator::GetFloatBufferCallback,Granulator::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo LoudnessMeter",
                  LoudnessMeter::CreateCallback,LoudnessMeter::ReleaseCallback,
                  LoudnessMeter::ProcessCallback,LoudnessMeter::SetFloatParameterCallback,
                  LoudnessMeter::GetFloatParameterCallback,LoudnessMeter::GetFloatBufferCallback,
                  LoudnessMeter::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo Oscilloscope",
                  Oscilloscope::CreateCallback,Oscilloscope::ReleaseCallback,
                  Oscilloscope::ProcessCallback,Oscilloscope::SetFloatParameterCallback,
                  Oscilloscope::GetFloatParameterCallback,Oscilloscope::GetFloatBufferCallback,
                  Oscilloscope::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo Routing",
                  Routing::CreateCallback,Routing::ReleaseCallback,Routing::ProcessCallback,
                  Routing::SetFloatParameterCallback,Routing::GetFloatParameterCallback,
                  Routing::GetFloatBufferCallback,Routing::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo Spatializer",
                  Spatializer::CreateCallback,Spatializer::ReleaseCallback,
                  Spatializer::ProcessCallback,Spatializer::SetFloatParameterCallback,
                  Spatializer::GetFloatParameterCallback,Spatializer::GetFloatBufferCallback,
                  Spatializer::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo Spatializer Reverb",
                  SpatializerReverb::CreateCallback,SpatializerReverb::ReleaseCallback,
                  SpatializerReverb::ProcessCallback,SpatializerReverb::SetFloatParameterCallback,
                  SpatializerReverb::GetFloatParameterCallback,
                  SpatializerReverb::GetFloatBufferCallback,
                  SpatializerReverb::InternalRegisterEffectDefinition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar2,"Demo Teleport",
                  Teleport::CreateCallback,Teleport::ReleaseCallback,Teleport::ProcessCallback,
                  Teleport::SetFloatParameterCallback,Teleport::GetFloatParameterCallback,
                  Teleport::GetFloatBufferCallback,Teleport::InternalRegisterEffectDefinition);
  }
  iVar1 = UnityGetAudioEffectDefinitions::numeffects;
  lVar2 = 0;
  uVar3 = 0;
  if (0 < UnityGetAudioEffectDefinitions::numeffects) {
    uVar3 = (ulong)(uint)UnityGetAudioEffectDefinitions::numeffects;
  }
  pUVar4 = UnityGetAudioEffectDefinitions::definition;
  for (; uVar3 * 8 != lVar2; lVar2 = lVar2 + 8) {
    *(UnityAudioEffectDefinition **)((long)UnityGetAudioEffectDefinitions::definitionp + lVar2) =
         pUVar4;
    pUVar4 = pUVar4 + 1;
  }
  *definitionptr = UnityGetAudioEffectDefinitions::definitionp;
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int AUDIO_CALLING_CONVENTION UnityGetAudioEffectDefinitions(UnityAudioEffectDefinition*** definitionptr)
{
    static UnityAudioEffectDefinition definition[256];
    static UnityAudioEffectDefinition* definitionp[256];
    static int numeffects = 0;
    if (numeffects == 0)
    {
        #include "PluginList.h"
    }
    for (int n = 0; n < numeffects; n++)
        definitionp[n] = &definition[n];
    *definitionptr = definitionp;
    return numeffects;
}